

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int * Dau_DsdNormalizePerm(char *pStr,int *pMarks,int nMarks)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong local_48;
  
  uVar9 = (ulong)(uint)nMarks;
  if (0 < nMarks) {
    uVar4 = 0;
    piVar5 = Dau_DsdNormalizePerm::pPerm;
    do {
      *piVar5 = (int)uVar4;
      uVar4 = uVar4 + 1;
      piVar5 = piVar5 + 1;
    } while (uVar9 != uVar4);
  }
  if (0 < nMarks) {
    local_48 = 1;
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      iVar3 = (int)uVar4;
      if (uVar1 < uVar9) {
        uVar7 = uVar4 & 0xffffffff;
        uVar8 = local_48;
        do {
          iVar3 = Dau_DsdNormalizeCompare
                            (pStr,pMarks,Dau_DsdNormalizePerm::pPerm[(int)uVar7],
                             Dau_DsdNormalizePerm::pPerm[uVar8]);
          uVar6 = uVar8 & 0xffffffff;
          if (iVar3 != 1) {
            uVar6 = uVar7;
          }
          uVar8 = uVar8 + 1;
          iVar3 = (int)uVar6;
          uVar7 = uVar6;
        } while (uVar9 != uVar8);
      }
      iVar2 = Dau_DsdNormalizePerm::pPerm[uVar4];
      Dau_DsdNormalizePerm::pPerm[uVar4] = Dau_DsdNormalizePerm::pPerm[iVar3];
      Dau_DsdNormalizePerm::pPerm[iVar3] = iVar2;
      local_48 = local_48 + 1;
      uVar4 = uVar1;
    } while (uVar1 != uVar9);
  }
  return Dau_DsdNormalizePerm::pPerm;
}

Assistant:

int * Dau_DsdNormalizePerm( char * pStr, int * pMarks, int nMarks )
{
    static int pPerm[DAU_MAX_VAR];
    int i, k;
    for ( i = 0; i < nMarks; i++ )
        pPerm[i] = i;
    for ( i = 0; i < nMarks; i++ )
    {
        int iBest = i;
        for ( k = i + 1; k < nMarks; k++ )
            if ( Dau_DsdNormalizeCompare( pStr, pMarks, pPerm[iBest], pPerm[k] ) == 1 )
                iBest = k;
        ABC_SWAP( int, pPerm[i], pPerm[iBest] );
    }
    return pPerm;
}